

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  bool bVar1;
  iterator ppEVar2;
  Diagnostic *pDVar3;
  reference ppEVar4;
  unsigned_long local_68;
  size_t provided;
  Expression *arg;
  iterator __end2;
  iterator __begin2;
  Args *__range2;
  Args *args_local;
  bool isMethod_local;
  ASTContext *context_local;
  SystemSubroutine *this_local;
  SourceRange callRange_local;
  
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(args);
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(args);
  while( true ) {
    if (__end2 == ppEVar2) {
      local_68 = nonstd::span_lite::
                 span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size(args);
      if (isMethod) {
        if (local_68 == 0) {
          assert::assertFailed
                    ("provided",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/SystemSubroutine.cpp"
                     ,0x2f,
                     "bool slang::ast::SystemSubroutine::checkArgCount(const ASTContext &, bool, const Args &, SourceRange, size_t, size_t) const"
                    );
        }
        local_68 = local_68 - 1;
      }
      if (local_68 < min) {
        pDVar3 = ASTContext::addDiag(context,(DiagCode)0x8c0007,callRange);
        pDVar3 = Diagnostic::operator<<(pDVar3,&this->name);
        pDVar3 = Diagnostic::operator<<(pDVar3,min);
        Diagnostic::operator<<(pDVar3,local_68);
        callRange_local.endLoc._7_1_ = 0;
      }
      else if (max < local_68) {
        ppEVar4 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (args,max);
        pDVar3 = ASTContext::addDiag(context,(DiagCode)0x8d0007,(*ppEVar4)->sourceRange);
        pDVar3 = Diagnostic::operator<<(pDVar3,&this->name);
        pDVar3 = Diagnostic::operator<<(pDVar3,max);
        Diagnostic::operator<<(pDVar3,local_68);
        callRange_local.endLoc._7_1_ = 0;
      }
      else {
        callRange_local.endLoc._7_1_ = 1;
      }
      return (bool)callRange_local.endLoc._7_1_;
    }
    bVar1 = Expression::bad(*__end2);
    if (bVar1) break;
    __end2 = __end2 + 1;
  }
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}